

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_result_modifier.cpp
# Opt level: O3

BoundOrderByNode * __thiscall
duckdb::BoundOrderByNode::Copy(BoundOrderByNode *__return_storage_ptr__,BoundOrderByNode *this)

{
  OrderType type;
  OrderByNullType null_order;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var1;
  _func_int *p_Var2;
  pointer pEVar3;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_40;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  _Var1._M_head_impl =
       (this->stats).
       super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  type = this->type;
  null_order = this->null_order;
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (&this->expression);
  p_Var2 = (pEVar3->super_BaseExpression)._vptr_BaseExpression[0x11];
  if (_Var1._M_head_impl == (BaseStatistics *)0x0) {
    (*p_Var2)((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
              &stack0xffffffffffffffd0,pEVar3);
    BoundOrderByNode(__return_storage_ptr__,type,null_order,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&stack0xffffffffffffffd0);
    local_38._M_head_impl = (Expression *)local_30._M_pi;
  }
  else {
    (*p_Var2)(&stack0xffffffffffffffc8,pEVar3);
    unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
    operator->(&this->stats);
    BaseStatistics::ToUnique((BaseStatistics *)&stack0xffffffffffffffc0);
    BoundOrderByNode(__return_storage_ptr__,type,null_order,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&stack0xffffffffffffffc8,
                     (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                      *)&stack0xffffffffffffffc0);
    if (local_40._M_head_impl != (BaseStatistics *)0x0) {
      BaseStatistics::~BaseStatistics(local_40._M_head_impl);
      operator_delete(local_40._M_head_impl);
    }
    local_40._M_head_impl = (BaseStatistics *)0x0;
  }
  if (local_38._M_head_impl != (Expression *)0x0) {
    (*((local_38._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundOrderByNode BoundOrderByNode::Copy() const {
	if (stats) {
		return BoundOrderByNode(type, null_order, expression->Copy(), stats->ToUnique());
	} else {
		return BoundOrderByNode(type, null_order, expression->Copy());
	}
}